

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

Vars * __thiscall
google::protobuf::compiler::cpp::FieldGenerator::PushVarsForCall
          (Vars *__return_storage_ptr__,FieldGenerator *this,Printer *p)

{
  Printer *pPVar1;
  Span<const_google::protobuf::io::Printer::Sub> local_60 [2];
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  Span<const_google::protobuf::io::Printer::Sub> local_30;
  Printer *local_20;
  Printer *p_local;
  FieldGenerator *this_local;
  
  local_20 = p;
  p_local = (Printer *)this;
  this_local = (FieldGenerator *)__return_storage_ptr__;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_30,&this->field_vars_);
  protobuf::io::Printer::WithVars(&__return_storage_ptr__->cleanup1,p,local_30);
  pPVar1 = local_20;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&this->tracker_vars_);
  protobuf::io::Printer::WithVars(&__return_storage_ptr__->cleanup2,pPVar1,local_40);
  pPVar1 = local_20;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_60,&this->per_generator_vars_);
  protobuf::io::Printer::WithVars(&__return_storage_ptr__->cleanup3,pPVar1,local_60[0]);
  return __return_storage_ptr__;
}

Assistant:

auto PushVarsForCall(io::Printer* p) const {
    // NOTE: we use a struct here because:
    // * We want to ensure that order of evaluation below is well-defined,
    //   which {...} guarantees but (...) does not.
    // * We do not require C++17 as of writing and therefore cannot use
    //   std::tuple with CTAD.
    // * std::make_tuple uses (...), not {...}.
    struct Vars {
      decltype(p->WithVars(field_vars_)) cleanup1;
      decltype(p->WithVars(tracker_vars_)) cleanup2;
      decltype(p->WithVars(per_generator_vars_)) cleanup3;
    };

    return Vars{p->WithVars(field_vars_), p->WithVars(tracker_vars_),
                p->WithVars(per_generator_vars_)};
  }